

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

int __thiscall xmrig::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int in_EAX;
  int extraout_EAX;
  size_t sVar1;
  char *__dest;
  void *pvVar2;
  
  if (this->m_data != (char *)0x0) {
    operator_delete__(this->m_data);
    in_EAX = extraout_EAX;
  }
  if (dst != (EVP_PKEY_CTX *)0x0) {
    sVar1 = strlen((char *)dst);
    this->m_size = sVar1;
    __dest = (char *)operator_new__(sVar1 + 1);
    this->m_data = __dest;
    pvVar2 = memcpy(__dest,dst,sVar1 + 1);
    return (int)pvVar2;
  }
  this->m_data = (char *)0x0;
  this->m_size = 0;
  return in_EAX;
}

Assistant:

void xmrig::String::copy(const char *str)
{
    delete [] m_data;

    if (str == nullptr) {
        m_size = 0;
        m_data = nullptr;

        return;
    }

    m_size = strlen(str);
    m_data = new char[m_size + 1];

    memcpy(m_data, str, m_size + 1);
}